

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O0

vector_t ** alloc_gau_acc(uint32 n_stream,uint32 n_density,uint32 *veclen,uint32 blksize)

{
  vector_t **pppfVar1;
  void *pvVar2;
  uint local_3c;
  uint local_38;
  uint32 l;
  uint32 k;
  uint32 j;
  float32 *buf;
  vector_t **param;
  uint32 blksize_local;
  uint32 *veclen_local;
  uint32 n_density_local;
  uint32 n_stream_local;
  
  pppfVar1 = (vector_t **)
             __ckd_calloc_2d__((ulong)n_stream,(ulong)n_density,8,
                               "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/kmeans_init/main.c"
                               ,0x3ec);
  pvVar2 = __ckd_calloc__((ulong)(n_density * blksize),4,
                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/kmeans_init/main.c"
                          ,0x3ee);
  local_3c = 0;
  for (l = 0; l < n_stream; l = l + 1) {
    for (local_38 = 0; local_38 < n_density; local_38 = local_38 + 1) {
      pppfVar1[l][local_38] = (vector_t)((long)pvVar2 + (ulong)local_3c * 4);
      local_3c = veclen[l] + local_3c;
    }
  }
  return pppfVar1;
}

Assistant:

static vector_t **
alloc_gau_acc(uint32 n_stream,
	      uint32 n_density,
	      const uint32 *veclen,
	      uint32 blksize)
{
    vector_t **param;
    float32 *buf;
    uint32 j, k, l;

    param = (vector_t **) ckd_calloc_2d(n_stream, n_density,
					sizeof(vector_t));
    
    buf = ckd_calloc(n_density * blksize, sizeof(float32));

    for (j = 0, l = 0; j < n_stream; j++) {
	for (k = 0; k < n_density; k++) {
	    param[j][k] = &buf[l];

	    l += veclen[j];
	}
    }

    return param;
}